

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

char * __thiscall expr_tree::strerror_abi_cxx11_(expr_tree *this,int __errnum)

{
  allocator<char> *__a;
  undefined4 in_register_00000034;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_11;
  long local_10;
  expr_tree *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__errnum);
  __a = (allocator<char> *)(ulong)(*(int *)(local_10 + 0x68) - 1);
  local_8 = this;
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator(&local_11);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd9);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd8);
  }
  return (char *)this;
}

Assistant:

std::string expr_tree::strerror()
{
    switch (errno_)
    {
    case T_ZERO_PWR:
        return "error: zero power of zero term detected";
    case T_ZERO_DIVIZION:
        return "error: division by zero detected";
    case T_LOG_ZERO:
        return "error: logarithm of zero";
    case T_NEGATIVE_ARG:
        return "error: logarithm of a negative number";
    default:
        return "semantic error";
        break;
    }
}